

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O0

void Prs_ManWriteVerilogIos(FILE *pFile,Prs_Ntk_t *p,int SigType)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *local_b0;
  Vec_Int_t *vSigsR [4];
  Vec_Int_t *vSigs [4];
  char *pSigNames [4];
  int i;
  int RangeId;
  int NameId;
  int SigType_local;
  Prs_Ntk_t *p_local;
  FILE *pFile_local;
  
  vSigs[3] = (Vec_Int_t *)anon_var_dwarf_12edbe;
  vSigsR[3] = &p->vInouts;
  vSigs[0] = &p->vInputs;
  vSigs[1] = &p->vOutputs;
  vSigs[2] = &p->vWires;
  vSigsR[0] = &p->vInputsR;
  vSigsR[1] = &p->vOutputsR;
  vSigsR[2] = &p->vWiresR;
  if (SigType == 3) {
    fprintf((FILE *)pFile,"\n");
  }
  for (pSigNames[3]._0_4_ = 0; iVar2 = Vec_IntSize(vSigsR[(long)SigType + 3]),
      (int)pSigNames[3] < iVar2; pSigNames[3]._0_4_ = (int)pSigNames[3] + 1) {
    iVar2 = Vec_IntEntry(vSigsR[(long)SigType + 3],(int)pSigNames[3]);
    iVar4 = Vec_IntEntry(vSigsR[(long)SigType + -1],(int)pSigNames[3]);
    pVVar1 = vSigs[(long)SigType + 3];
    iVar3 = Abc_LitIsCompl(iVar4);
    pcVar5 = "";
    if (iVar3 != 0) {
      pcVar5 = "signed ";
    }
    if (iVar4 == 0) {
      local_b0 = "";
    }
    else {
      iVar4 = Abc_Lit2Var(iVar4);
      local_b0 = Prs_ManWriteRange(p,iVar4,0);
    }
    fprintf((FILE *)pFile,"  %s %s%s",pVVar1,pcVar5,local_b0);
    pcVar5 = Prs_ObjGetName(p,iVar2);
    fprintf((FILE *)pFile,"%s;\n",pcVar5);
  }
  return;
}

Assistant:

static void Prs_ManWriteVerilogIos( FILE * pFile, Prs_Ntk_t * p, int SigType )
{
    int NameId, RangeId, i;
    char * pSigNames[4]   = { "inout", "input", "output", "wire" }; 
    Vec_Int_t * vSigs[4]  = { &p->vInouts,  &p->vInputs,  &p->vOutputs,  &p->vWires };
    Vec_Int_t * vSigsR[4] = { &p->vInoutsR, &p->vInputsR, &p->vOutputsR, &p->vWiresR };
    if ( SigType == 3 )
        fprintf( pFile, "\n" );
    Vec_IntForEachEntryTwo( vSigs[SigType], vSigsR[SigType], NameId, RangeId, i )
    {
        fprintf( pFile, "  %s %s%s", pSigNames[SigType], Abc_LitIsCompl(RangeId) ? "signed " : "", RangeId ? Prs_ManWriteRange(p, Abc_Lit2Var(RangeId), 0) : "" );
        fprintf( pFile, "%s;\n", Prs_ObjGetName(p, NameId) );
    }
}